

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O0

BOOL __thiscall
LASreadItemCompressed_RGBNIR14_v3::createAndInitModelsAndDecompressors
          (LASreadItemCompressed_RGBNIR14_v3 *this,U32 context,U8 *item)

{
  ArithmeticModel *pAVar1;
  U8 *item_local;
  U32 context_local;
  LASreadItemCompressed_RGBNIR14_v3 *this_local;
  
  if ((this->contexts[context].unused & 1U) != 0) {
    if ((this->requested_RGB & 1U) != 0) {
      if (this->contexts[context].m_rgb_bytes_used == (ArithmeticModel *)0x0) {
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x80);
        this->contexts[context].m_rgb_bytes_used = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x100);
        this->contexts[context].m_rgb_diff_0 = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x100);
        this->contexts[context].m_rgb_diff_1 = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x100);
        this->contexts[context].m_rgb_diff_2 = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x100);
        this->contexts[context].m_rgb_diff_3 = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x100);
        this->contexts[context].m_rgb_diff_4 = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_RGB,0x100);
        this->contexts[context].m_rgb_diff_5 = pAVar1;
      }
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_bytes_used,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_diff_0,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_diff_1,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_diff_2,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_diff_3,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_diff_4,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_RGB,this->contexts[context].m_rgb_diff_5,(U32 *)0x0);
    }
    if ((this->requested_NIR & 1U) != 0) {
      if (this->contexts[context].m_nir_bytes_used == (ArithmeticModel *)0x0) {
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_NIR,4);
        this->contexts[context].m_nir_bytes_used = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_NIR,0x100);
        this->contexts[context].m_nir_diff_0 = pAVar1;
        pAVar1 = ArithmeticDecoder::createSymbolModel(this->dec_NIR,0x100);
        this->contexts[context].m_nir_diff_1 = pAVar1;
      }
      ArithmeticDecoder::initSymbolModel
                (this->dec_NIR,this->contexts[context].m_nir_bytes_used,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_NIR,this->contexts[context].m_nir_diff_0,(U32 *)0x0);
      ArithmeticDecoder::initSymbolModel
                (this->dec_NIR,this->contexts[context].m_nir_diff_1,(U32 *)0x0);
    }
    *(undefined8 *)this->contexts[context].last_item = *(undefined8 *)item;
    this->contexts[context].unused = false;
    return true;
  }
  __assert_fail("contexts[context].unused",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v3.cpp"
                ,0x5e1,
                "BOOL LASreadItemCompressed_RGBNIR14_v3::createAndInitModelsAndDecompressors(U32, const U8 *)"
               );
}

Assistant:

inline BOOL LASreadItemCompressed_RGBNIR14_v3::createAndInitModelsAndDecompressors(U32 context, const U8* item)
{
  /* should only be called when context is unused */

  assert(contexts[context].unused);

  /* first create all entropy models (if needed) */

  if (requested_RGB)
  {
    if (contexts[context].m_rgb_bytes_used == 0)
    {
      contexts[context].m_rgb_bytes_used = dec_RGB->createSymbolModel(128);
      contexts[context].m_rgb_diff_0 = dec_RGB->createSymbolModel(256);
      contexts[context].m_rgb_diff_1 = dec_RGB->createSymbolModel(256);
      contexts[context].m_rgb_diff_2 = dec_RGB->createSymbolModel(256);
      contexts[context].m_rgb_diff_3 = dec_RGB->createSymbolModel(256);
      contexts[context].m_rgb_diff_4 = dec_RGB->createSymbolModel(256);
      contexts[context].m_rgb_diff_5 = dec_RGB->createSymbolModel(256);
    }

    /* then init entropy models */

    dec_RGB->initSymbolModel(contexts[context].m_rgb_bytes_used);
    dec_RGB->initSymbolModel(contexts[context].m_rgb_diff_0);
    dec_RGB->initSymbolModel(contexts[context].m_rgb_diff_1);
    dec_RGB->initSymbolModel(contexts[context].m_rgb_diff_2);
    dec_RGB->initSymbolModel(contexts[context].m_rgb_diff_3);
    dec_RGB->initSymbolModel(contexts[context].m_rgb_diff_4);
    dec_RGB->initSymbolModel(contexts[context].m_rgb_diff_5);
  }

  if (requested_NIR)
  {
    if (contexts[context].m_nir_bytes_used == 0)
    {
      contexts[context].m_nir_bytes_used = dec_NIR->createSymbolModel(4);
      contexts[context].m_nir_diff_0 = dec_NIR->createSymbolModel(256);
      contexts[context].m_nir_diff_1 = dec_NIR->createSymbolModel(256);
    }

    /* then init entropy models */

    dec_NIR->initSymbolModel(contexts[context].m_nir_bytes_used);
    dec_NIR->initSymbolModel(contexts[context].m_nir_diff_0);
    dec_NIR->initSymbolModel(contexts[context].m_nir_diff_1);
  }

  /* init current context from item */

  memcpy(contexts[context].last_item, item, 8);

  contexts[context].unused = FALSE;

  return TRUE;
}